

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

compressed_lower_distance_matrix * read_point_cloud(istream *input_stream)

{
  undefined1 uVar1;
  bool bVar2;
  istream *piVar3;
  size_t sVar4;
  ostream *this;
  ostream *poVar5;
  ostream *this_00;
  reference this_01;
  size_type sVar6;
  void *this_02;
  istream *in_RSI;
  compressed_lower_distance_matrix *in_RDI;
  value_t vVar7;
  int j;
  int i;
  vector<float,_std::allocator<float>_> distances;
  index_t n;
  euclidean_distance_matrix eucl_dist;
  istringstream s;
  vector<float,_std::allocator<float>_> point;
  value_t value;
  string line;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  value_type *in_stack_fffffffffffffd68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd70;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  int local_238;
  int local_234;
  istringstream local_1f8 [428];
  float local_4c;
  string local_48 [56];
  istream *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x149a61);
  std::__cxx11::string::string(local_48);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_48);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!(bool)uVar1) break;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x149abe);
    std::__cxx11::istringstream::istringstream(local_1f8,local_48,_S_in);
    while( true ) {
      in_stack_fffffffffffffd98 =
           (vector<float,_std::allocator<float>_> *)
           std::istream::operator>>((istream *)local_1f8,&local_4c);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&(in_stack_fffffffffffffd98->
                                        super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                        super__Vector_impl_data._M_start +
                                *(long *)((in_stack_fffffffffffffd98->
                                          super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                          .super__Vector_impl_data._M_start + -6)));
      if (!bVar2) break;
      std::vector<float,_std::allocator<float>_>::push_back
                (in_stack_fffffffffffffd70,(value_type_conflict1 *)in_stack_fffffffffffffd68);
      std::istream::ignore();
    }
    bVar2 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd70);
    if (!bVar2) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    std::__cxx11::istringstream::~istringstream(local_1f8);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffd70);
  }
  euclidean_distance_matrix::euclidean_distance_matrix
            ((euclidean_distance_matrix *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  sVar4 = euclidean_distance_matrix::size((euclidean_distance_matrix *)0x149c15);
  this = std::operator<<((ostream *)&std::cout,"point cloud with ");
  poVar5 = (ostream *)std::ostream::operator<<(this,(int)sVar4);
  this_00 = std::operator<<(poVar5," points in dimension ");
  this_01 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::front((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  sVar6 = std::vector<float,_std::allocator<float>_>::size(this_01);
  this_02 = (void *)std::ostream::operator<<(this_00,sVar6);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x149cb8);
  for (local_234 = 0; local_234 < (int)sVar4; local_234 = local_234 + 1) {
    for (local_238 = 0; local_238 < local_234; local_238 = local_238 + 1) {
      vVar7 = euclidean_distance_matrix::operator()
                        ((euclidean_distance_matrix *)this,(index_t)((ulong)poVar5 >> 0x20),
                         (index_t)poVar5);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)CONCAT44(vVar7,in_stack_fffffffffffffd60),
                 (value_type_conflict1 *)in_stack_fffffffffffffd58);
    }
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            ((compressed_distance_matrix<(compressed_matrix_layout)0> *)
             CONCAT17(uVar1,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)this_00);
  euclidean_distance_matrix::~euclidean_distance_matrix((euclidean_distance_matrix *)0x149da3);
  std::__cxx11::string::~string(local_48);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)this_00);
  return in_RDI;
}

Assistant:

compressed_lower_distance_matrix read_point_cloud(std::istream& input_stream) {
	std::vector<std::vector<value_t>> points;

	std::string line;
	value_t value;
	while (std::getline(input_stream, line)) {
		std::vector<value_t> point;
		std::istringstream s(line);
		while (s >> value) {
			point.push_back(value);
			s.ignore();
		}
		if (!point.empty()) points.push_back(point);
		assert(point.size() == points.front().size());
	}

	euclidean_distance_matrix eucl_dist(std::move(points));

	index_t n = index_t(eucl_dist.size());

	std::cout << "point cloud with " << n << " points in dimension " << eucl_dist.points.front().size() << std::endl;

	std::vector<value_t> distances;

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < i; ++j) distances.push_back(eucl_dist(i, j));

	return compressed_lower_distance_matrix(std::move(distances));
}